

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::sse2::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  Vec3fx *pVVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  PrimRefMB *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  LBBox3fx *pLVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  size_t *psVar15;
  undefined4 uVar16;
  long lVar17;
  unsigned_long uVar18;
  float fVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint uVar27;
  float fVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar40;
  float fVar41;
  undefined1 auVar37 [12];
  undefined1 auVar38 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar39;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar47;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar58 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  ulong local_138;
  unsigned_long local_100;
  size_t local_f8;
  size_t local_f0;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar20 = r->_begin;
  uVar18 = r->_end;
  aVar59 = _DAT_01f7aa00;
  aVar62 = _DAT_01f7a9f0;
  if (uVar20 < uVar18) {
    fVar28 = 0.0;
    fVar30 = 1.0;
    fVar44 = 1.0;
    local_100 = 0;
    _local_b8 = _DAT_01f7a9f0;
    _local_98 = _DAT_01f7a9f0;
    local_88 = _DAT_01f7aa00;
    local_a8 = _DAT_01f7aa00;
    local_f8 = 0;
    local_138 = 0;
    fVar63 = 0.0;
    local_f0 = k;
    do {
      BVar4 = (this->super_Points).super_Geometry.time_range;
      fVar42 = BVar4.lower;
      fVar48 = BVar4.upper;
      fVar54 = (this->super_Points).super_Geometry.fnumTimeSegments;
      fVar22 = t0t1->lower;
      fVar24 = t0t1->upper;
      fVar21 = ceilf(((fVar24 - fVar42) / (fVar48 - fVar42)) * 0.99999976 * fVar54);
      fVar19 = (float)uVar20;
      pBVar5 = (this->super_Points).vertices.items;
      if ((uVar20 & 0xffffffff) < (pBVar5->super_RawBufferView).num) {
        if (fVar54 <= fVar21) {
          fVar21 = fVar54;
        }
        fVar22 = fVar22 - fVar42;
        fVar23 = floorf((fVar22 / (fVar48 - fVar42)) * 1.0000002 * fVar54);
        fVar31 = 0.0;
        if (0.0 <= fVar23) {
          fVar31 = fVar23;
        }
        if ((uint)(int)fVar31 <= (uint)(int)fVar21) {
          uVar13 = (ulong)(int)fVar31;
          psVar15 = &pBVar5[uVar13].super_RawBufferView.stride;
          do {
            pfVar1 = (float *)(((RawBufferView *)(psVar15 + -2))->ptr_ofs +
                              *psVar15 * (uVar20 & 0xffffffff));
            fVar31 = pfVar1[3];
            auVar61._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
            auVar61._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
            auVar61._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
            auVar61._12_4_ = -(uint)(fVar31 <= -1.844e+18);
            if ((fVar31 < 0.0) ||
               (auVar65._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]),
               auVar65._0_4_ = -(uint)(1.844e+18 <= *pfVar1),
               auVar65._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]),
               auVar65._12_4_ = -(uint)(1.844e+18 <= fVar31),
               uVar16 = movmskps((int)((RawBufferView *)(psVar15 + -2))->ptr_ofs,auVar61 | auVar65),
               (char)uVar16 != '\0')) goto LAB_009ef2be;
            uVar13 = uVar13 + 1;
            psVar15 = psVar15 + 7;
          } while (uVar13 <= (ulong)(long)(int)fVar21);
        }
        fVar22 = fVar22 / (fVar48 - fVar42);
        fVar23 = (fVar24 - fVar42) / (fVar48 - fVar42);
        fVar31 = fVar54 * fVar23;
        fVar24 = floorf(fVar54 * fVar22);
        fVar21 = ceilf(fVar31);
        iVar12 = (int)fVar24;
        if (fVar24 <= 0.0) {
          fVar24 = 0.0;
        }
        fVar25 = fVar21;
        if (fVar54 <= fVar21) {
          fVar25 = fVar54;
        }
        if (iVar12 < 0) {
          iVar12 = -1;
        }
        uVar27 = (int)fVar54 + 1U;
        if ((int)fVar21 < (int)((int)fVar54 + 1U)) {
          uVar27 = (int)fVar21;
        }
        lVar14 = (long)(int)fVar24;
        pfVar1 = (float *)(pBVar5[lVar14].super_RawBufferView.ptr_ofs +
                          pBVar5[lVar14].super_RawBufferView.stride * uVar20);
        fVar35 = pfVar1[3];
        fVar21 = (this->super_Points).maxRadiusScale;
        fVar43 = *pfVar1 - fVar35 * fVar21;
        fVar49 = pfVar1[1] - fVar35 * fVar21;
        fVar50 = pfVar1[2] - fVar35 * fVar21;
        fVar32 = fVar35 * fVar21 + *pfVar1;
        fVar33 = fVar35 * fVar21 + pfVar1[1];
        fVar34 = fVar35 * fVar21 + pfVar1[2];
        lVar17 = (long)(int)fVar25;
        pfVar1 = (float *)(pBVar5[lVar17].super_RawBufferView.ptr_ofs +
                          pBVar5[lVar17].super_RawBufferView.stride * uVar20);
        fVar26 = pfVar1[3];
        fVar51 = *pfVar1 - fVar26 * fVar21;
        fVar52 = pfVar1[1] - fVar26 * fVar21;
        fVar53 = pfVar1[2] - fVar26 * fVar21;
        fVar36 = fVar26 * fVar21 + *pfVar1;
        fVar40 = fVar26 * fVar21 + pfVar1[1];
        fVar41 = fVar26 * fVar21 + pfVar1[2];
        fVar24 = fVar54 * fVar22 - fVar24;
        if (uVar27 - iVar12 == 1) {
          if (fVar24 <= 0.0) {
            fVar24 = 0.0;
          }
          fVar54 = 1.0 - fVar24;
          auVar45._4_4_ = fVar49 * fVar54 + fVar24 * fVar52;
          auVar45._0_4_ = fVar43 * fVar54 + fVar24 * fVar51;
          fVar55 = fVar54 * fVar32 + fVar24 * fVar36;
          fVar56 = fVar54 * fVar33 + fVar24 * fVar40;
          fVar57 = fVar54 * fVar34 + fVar24 * fVar41;
          fVar25 = fVar25 - fVar31;
          if (fVar25 <= 0.0) {
            fVar25 = 0.0;
          }
          fVar22 = 1.0 - fVar25;
          fVar31 = fVar51 * fVar22 + fVar43 * fVar25;
          fVar43 = fVar52 * fVar22 + fVar49 * fVar25;
          fVar49 = fVar53 * fVar22 + fVar50 * fVar25;
          auVar37._4_4_ = fVar22 * fVar40 + fVar25 * fVar33;
          auVar37._0_4_ = fVar22 * fVar36 + fVar25 * fVar32;
          auVar37._8_4_ = fVar22 * fVar41 + fVar25 * fVar34;
          auVar45._8_4_ = fVar50 * fVar54 + fVar24 * fVar53;
        }
        else {
          pfVar1 = (float *)(pBVar5[lVar14 + 1].super_RawBufferView.ptr_ofs +
                            pBVar5[lVar14 + 1].super_RawBufferView.stride * uVar20);
          fVar9 = pfVar1[3];
          pfVar2 = (float *)(pBVar5[lVar17 + -1].super_RawBufferView.ptr_ofs +
                            pBVar5[lVar17 + -1].super_RawBufferView.stride * uVar20);
          fVar10 = pfVar2[3];
          if (fVar24 <= 0.0) {
            fVar24 = 0.0;
          }
          fVar66 = 1.0 - fVar24;
          auVar45._0_4_ = fVar43 * fVar66 + (*pfVar1 - fVar9 * fVar21) * fVar24;
          auVar45._4_4_ = fVar49 * fVar66 + (pfVar1[1] - fVar9 * fVar21) * fVar24;
          auVar45._8_4_ = fVar50 * fVar66 + (pfVar1[2] - fVar9 * fVar21) * fVar24;
          auVar46._12_4_ = (fVar35 - fVar35 * fVar21) * fVar66 + (fVar9 - fVar9 * fVar21) * fVar24;
          auVar46._0_12_ = auVar45;
          fVar55 = fVar32 * fVar66 + fVar24 * (fVar9 * fVar21 + *pfVar1);
          fVar56 = fVar33 * fVar66 + fVar24 * (fVar9 * fVar21 + pfVar1[1]);
          fVar57 = fVar34 * fVar66 + fVar24 * (fVar9 * fVar21 + pfVar1[2]);
          fVar35 = (fVar35 * fVar21 + fVar35) * fVar66 + fVar24 * (fVar9 * fVar21 + fVar9);
          fVar24 = fVar25 - fVar31;
          if (fVar25 - fVar31 <= 0.0) {
            fVar24 = 0.0;
          }
          fVar32 = 1.0 - fVar24;
          fVar31 = fVar51 * fVar32 + (*pfVar2 - fVar10 * fVar21) * fVar24;
          fVar43 = fVar52 * fVar32 + (pfVar2[1] - fVar10 * fVar21) * fVar24;
          fVar49 = fVar53 * fVar32 + (pfVar2[2] - fVar10 * fVar21) * fVar24;
          fVar25 = (fVar26 - fVar26 * fVar21) * fVar32 + (fVar10 - fVar10 * fVar21) * fVar24;
          auVar37._0_4_ = fVar36 * fVar32 + fVar24 * (fVar10 * fVar21 + *pfVar2);
          auVar37._4_4_ = fVar40 * fVar32 + fVar24 * (fVar10 * fVar21 + pfVar2[1]);
          auVar37._8_4_ = fVar41 * fVar32 + fVar24 * (fVar10 * fVar21 + pfVar2[2]);
          auVar38._12_4_ = (fVar26 * fVar21 + fVar26) * fVar32 + fVar24 * (fVar10 * fVar21 + fVar10)
          ;
          auVar38._0_12_ = auVar37;
          uVar29 = iVar12 + 1;
          if ((int)uVar29 < (int)uVar27) {
            psVar15 = &pBVar5[uVar29].super_RawBufferView.stride;
            do {
              fVar32 = ((float)(int)uVar29 / fVar54 - fVar22) / (fVar23 - fVar22);
              fVar26 = 1.0 - fVar32;
              pfVar1 = (float *)(((RawBufferView *)(psVar15 + -2))->ptr_ofs + *psVar15 * uVar20);
              fVar24 = pfVar1[3];
              auVar64._0_4_ =
                   (*pfVar1 - fVar24 * fVar21) - (auVar46._0_4_ * fVar26 + fVar31 * fVar32);
              auVar64._4_4_ =
                   (pfVar1[1] - fVar24 * fVar21) - (auVar46._4_4_ * fVar26 + fVar43 * fVar32);
              auVar64._8_4_ =
                   (pfVar1[2] - fVar24 * fVar21) - (auVar46._8_4_ * fVar26 + fVar49 * fVar32);
              auVar64._12_4_ =
                   (fVar24 - fVar24 * fVar21) - (auVar46._12_4_ * fVar26 + fVar25 * fVar32);
              auVar60._0_4_ =
                   (fVar24 * fVar21 + *pfVar1) - (fVar26 * fVar55 + fVar32 * auVar38._0_4_);
              auVar60._4_4_ =
                   (fVar24 * fVar21 + pfVar1[1]) - (fVar26 * fVar56 + fVar32 * auVar38._4_4_);
              auVar60._8_4_ =
                   (fVar24 * fVar21 + pfVar1[2]) - (fVar26 * fVar57 + fVar32 * auVar38._8_4_);
              auVar60._12_4_ =
                   (fVar24 * fVar21 + fVar24) - (fVar26 * fVar35 + fVar32 * auVar38._12_4_);
              auVar65 = minps(auVar64,ZEXT816(0));
              auVar61 = maxps(auVar60,ZEXT816(0));
              auVar45._0_4_ = auVar46._0_4_ + auVar65._0_4_;
              auVar45._4_4_ = auVar46._4_4_ + auVar65._4_4_;
              auVar45._8_4_ = auVar46._8_4_ + auVar65._8_4_;
              auVar46._12_4_ = auVar46._12_4_ + auVar65._12_4_;
              auVar46._0_12_ = auVar45;
              fVar31 = fVar31 + auVar65._0_4_;
              fVar43 = fVar43 + auVar65._4_4_;
              fVar49 = fVar49 + auVar65._8_4_;
              fVar25 = fVar25 + auVar65._12_4_;
              fVar55 = fVar55 + auVar61._0_4_;
              fVar56 = fVar56 + auVar61._4_4_;
              fVar57 = fVar57 + auVar61._8_4_;
              fVar35 = fVar35 + auVar61._12_4_;
              auVar37._0_4_ = auVar38._0_4_ + auVar61._0_4_;
              auVar37._4_4_ = auVar38._4_4_ + auVar61._4_4_;
              auVar37._8_4_ = auVar38._8_4_ + auVar61._8_4_;
              auVar38._12_4_ = auVar38._12_4_ + auVar61._12_4_;
              auVar38._0_12_ = auVar37;
              uVar29 = uVar29 + 1;
              psVar15 = psVar15 + 7;
            } while (uVar27 != uVar29);
          }
        }
        fVar22 = (float)((this->super_Points).super_Geometry.numTimeSteps - 1);
        uVar13 = (ulong)(uint)fVar22;
        aVar47.m128[3] = (float)geomID;
        aVar47._0_12_ = auVar45;
        aVar39.m128[3] = fVar22;
        aVar39._0_12_ = auVar37;
        auVar58._0_4_ = fVar55 * 0.5 + auVar37._0_4_ * 0.5 + auVar45._0_4_ * 0.5 + fVar31 * 0.5;
        auVar58._4_4_ = fVar56 * 0.5 + auVar37._4_4_ * 0.5 + auVar45._4_4_ * 0.5 + fVar43 * 0.5;
        auVar58._8_4_ = fVar57 * 0.5 + auVar37._8_4_ * 0.5 + auVar45._8_4_ * 0.5 + fVar49 * 0.5;
        auVar58._12_4_ = fVar19 * 0.5 + fVar22 * 0.5 + (float)geomID * 0.5 + fVar22 * 0.5;
        _local_98 = (__m128)minps(_local_98,auVar58);
        local_a8.m128 = (__m128)maxps(local_a8.m128,auVar58);
        fVar54 = fVar48;
        if (fVar48 <= fVar63) {
          fVar54 = fVar63;
        }
        local_100 = local_100 + 1;
        local_f8 = local_f8 + uVar13;
        uVar27 = (int)((uint)(local_138 < uVar13) << 0x1f) >> 0x1f;
        uVar29 = (int)((uint)(local_138 < uVar13) << 0x1f) >> 0x1f;
        fVar28 = (float)(~uVar27 & (uint)fVar28 | (uint)fVar42 & uVar27);
        fVar30 = (float)(~uVar29 & (uint)fVar30 | (uint)fVar48 & uVar29);
        _local_b8 = (__m128)minps(_local_b8,aVar47.m128);
        if (local_138 <= uVar13) {
          local_138 = uVar13;
        }
        pPVar6 = prims->items;
        pPVar6[local_f0].lbounds.bounds0.lower.field_0 = aVar47;
        auVar7._4_4_ = fVar56;
        auVar7._0_4_ = fVar55;
        auVar7._8_4_ = fVar57;
        auVar7._12_4_ = fVar19;
        local_88.m128 = (__m128)maxps(local_88.m128,auVar7);
        pVVar3 = &pPVar6[local_f0].lbounds.bounds0.upper;
        (pVVar3->field_0).m128[0] = fVar55;
        (pVVar3->field_0).m128[1] = fVar56;
        (pVVar3->field_0).m128[2] = fVar57;
        (pVVar3->field_0).m128[3] = fVar19;
        auVar8._4_4_ = fVar43;
        auVar8._0_4_ = fVar31;
        auVar8._8_4_ = fVar49;
        auVar8._12_4_ = fVar22;
        aVar62.m128 = (__m128)minps(aVar62.m128,auVar8);
        pLVar11 = &pPVar6[local_f0].lbounds;
        (pLVar11->bounds1).lower.field_0.m128[0] = fVar31;
        (pLVar11->bounds1).lower.field_0.m128[1] = fVar43;
        (pLVar11->bounds1).lower.field_0.m128[2] = fVar49;
        (pLVar11->bounds1).lower.field_0.m128[3] = fVar22;
        aVar59.m128 = (__m128)maxps(aVar59.m128,aVar39.m128);
        pPVar6[local_f0].lbounds.bounds1.upper.field_0 = aVar39;
        if (fVar42 <= fVar44) {
          fVar44 = fVar42;
        }
        pPVar6[local_f0].time_range.lower = fVar42;
        pPVar6[local_f0].time_range.upper = fVar48;
        local_f0 = local_f0 + 1;
        uVar18 = r->_end;
        fVar63 = fVar54;
      }
LAB_009ef2be:
      uVar20 = uVar20 + 1;
    } while (uVar20 < uVar18);
    (__return_storage_ptr__->object_range)._end = local_100;
  }
  else {
    fVar28 = 0.0;
    fVar30 = 1.0;
    local_98._0_4_ = (undefined4)DAT_01f7a9f0;
    local_98._4_4_ = DAT_01f7a9f0._4_4_;
    fStack_90 = DAT_01f7a9f0._8_4_;
    fStack_8c = DAT_01f7a9f0._12_4_;
    fVar44 = 1.0;
    fVar63 = 0.0;
    local_138 = 0;
    local_f8 = 0;
    local_88 = _DAT_01f7aa00;
    local_a8 = _DAT_01f7aa00;
    local_b8._0_4_ = local_98._0_4_;
    local_b8._4_4_ = local_98._4_4_;
    fStack_b0 = fStack_90;
    fStack_ac = fStack_8c;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = (float)local_b8._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = (float)local_b8._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = fStack_b0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = fStack_ac;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = local_88;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar62;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar59;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = (float)local_98._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = (float)local_98._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = fStack_90;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = fStack_8c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_a8;
  (__return_storage_ptr__->time_range).lower = fVar44;
  (__return_storage_ptr__->time_range).upper = fVar63;
  __return_storage_ptr__->num_time_segments = local_f8;
  __return_storage_ptr__->max_num_time_segments = local_138;
  (__return_storage_ptr__->max_time_range).lower = fVar28;
  (__return_storage_ptr__->max_time_range).upper = fVar30;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }